

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void get_unshared_pnodes(Parser *p,PNode *x,PNode *y,VecPNode *pvx,VecPNode *pvy)

{
  uint uVar1;
  PNode *pPVar2;
  uint32 uVar3;
  int iVar4;
  PNode *_t_1;
  PNode *_t;
  VecPNode sy;
  VecPNode sx;
  VecPNode hy;
  VecPNode hx;
  uint i;
  VecPNode *pvy_local;
  VecPNode *pvx_local;
  PNode *y_local;
  PNode *x_local;
  Parser *p_local;
  
  hy.e[2]._0_4_ = 0;
  hx.n = 0;
  hx.i = 0;
  sx.e[2]._0_4_ = 0;
  hy.n = 0;
  hy.i = 0;
  sy.e[2]._0_4_ = 0;
  sx.n = 0;
  sx.i = 0;
  _t._0_4_ = 0;
  sy.n = 0;
  sy.i = 0;
  while (x->latest != x->latest->latest) {
    pPVar2 = x->latest->latest;
    pPVar2->refcount = pPVar2->refcount + 1;
    uVar3 = x->latest->refcount - 1;
    x->latest->refcount = uVar3;
    if (uVar3 == 0) {
      free_PNode(p,x->latest);
    }
    x->latest = pPVar2;
  }
  y_local = x->latest;
  while (y->latest != y->latest->latest) {
    pPVar2 = y->latest->latest;
    pPVar2->refcount = pPVar2->refcount + 1;
    uVar3 = y->latest->refcount - 1;
    y->latest->refcount = uVar3;
    if (uVar3 == 0) {
      free_PNode(p,y->latest);
    }
    y->latest = pPVar2;
  }
  pvx_local = (VecPNode *)y->latest;
  set_add(sy.e + 2,y_local);
  set_add(&_t,pvx_local);
  while ((y_local != (PNode *)0x0 || (pvx_local != (VecPNode *)0x0))) {
    if ((pvx_local == (VecPNode *)0x0) ||
       ((y_local != (PNode *)0x0 && (*(uint *)(pvx_local->e + 1) < y_local->height)))) {
      get_children(p,y_local,(VecPNode *)(sy.e + 2),(VecPNode *)&_t,(VecPNode *)(hy.e + 2));
      y_local = heap_pop((VecPNode *)(hy.e + 2));
    }
    else {
      get_children(p,(PNode *)pvx_local,(VecPNode *)&_t,(VecPNode *)(sy.e + 2),
                   (VecPNode *)(sx.e + 2));
      pvx_local = (VecPNode *)heap_pop((VecPNode *)(sx.e + 2));
    }
  }
  for (hx.e[2]._4_4_ = 0; hx.e[2]._4_4_ < (uint)sy.e[2]; hx.e[2]._4_4_ = hx.e[2]._4_4_ + 1) {
    if ((*(long *)(sx._0_8_ + (ulong)hx.e[2]._4_4_ * 8) != 0) &&
       (iVar4 = set_find(&_t,*(void **)(sx._0_8_ + (ulong)hx.e[2]._4_4_ * 8)), iVar4 == 0)) {
      if (pvx->v == (PNode **)0x0) {
        pPVar2 = *(PNode **)(sx._0_8_ + (ulong)hx.e[2]._4_4_ * 8);
        pvx->v = pvx->e;
        uVar1 = pvx->n;
        pvx->n = uVar1 + 1;
        pvx->e[uVar1] = pPVar2;
      }
      else if (pvx->v == pvx->e) {
        if (pvx->n < 3) {
          pPVar2 = *(PNode **)(sx._0_8_ + (ulong)hx.e[2]._4_4_ * 8);
          uVar1 = pvx->n;
          pvx->n = uVar1 + 1;
          pvx->v[uVar1] = pPVar2;
        }
        else {
LAB_00153871:
          vec_add_internal(pvx,*(void **)(sx._0_8_ + (ulong)hx.e[2]._4_4_ * 8));
        }
      }
      else {
        if ((pvx->n & 7) == 0) goto LAB_00153871;
        pPVar2 = *(PNode **)(sx._0_8_ + (ulong)hx.e[2]._4_4_ * 8);
        uVar1 = pvx->n;
        pvx->n = uVar1 + 1;
        pvx->v[uVar1] = pPVar2;
      }
    }
  }
  hx.e[2]._4_4_ = 0;
  do {
    if ((uint)_t <= hx.e[2]._4_4_) {
      if ((hx._0_8_ != 0) && ((PNode ***)hx._0_8_ != &hx.v)) {
        free((void *)hx._0_8_);
      }
      hy.e[2]._0_4_ = 0;
      hx.n = 0;
      hx.i = 0;
      if ((hy._0_8_ != 0) && ((PNode ***)hy._0_8_ != &hy.v)) {
        free((void *)hy._0_8_);
      }
      sx.e[2]._0_4_ = 0;
      hy.n = 0;
      hy.i = 0;
      if ((sx._0_8_ != 0) && ((PNode ***)sx._0_8_ != &sx.v)) {
        free((void *)sx._0_8_);
      }
      sy.e[2]._0_4_ = 0;
      sx.n = 0;
      sx.i = 0;
      if ((sy._0_8_ != 0) && ((PNode ***)sy._0_8_ != &sy.v)) {
        free((void *)sy._0_8_);
      }
      return;
    }
    if ((*(long *)(sy._0_8_ + (ulong)hx.e[2]._4_4_ * 8) != 0) &&
       (iVar4 = set_find(sy.e + 2,*(void **)(sy._0_8_ + (ulong)hx.e[2]._4_4_ * 8)), iVar4 == 0)) {
      if (pvy->v == (PNode **)0x0) {
        pPVar2 = *(PNode **)(sy._0_8_ + (ulong)hx.e[2]._4_4_ * 8);
        pvy->v = pvy->e;
        uVar1 = pvy->n;
        pvy->n = uVar1 + 1;
        pvy->e[uVar1] = pPVar2;
      }
      else if (pvy->v == pvy->e) {
        if (pvy->n < 3) {
          pPVar2 = *(PNode **)(sy._0_8_ + (ulong)hx.e[2]._4_4_ * 8);
          uVar1 = pvy->n;
          pvy->n = uVar1 + 1;
          pvy->v[uVar1] = pPVar2;
        }
        else {
LAB_001539b7:
          vec_add_internal(pvy,*(void **)(sy._0_8_ + (ulong)hx.e[2]._4_4_ * 8));
        }
      }
      else {
        if ((pvy->n & 7) == 0) goto LAB_001539b7;
        pPVar2 = *(PNode **)(sy._0_8_ + (ulong)hx.e[2]._4_4_ * 8);
        uVar1 = pvy->n;
        pvy->n = uVar1 + 1;
        pvy->v[uVar1] = pPVar2;
      }
    }
    hx.e[2]._4_4_ = hx.e[2]._4_4_ + 1;
  } while( true );
}

Assistant:

static void get_unshared_pnodes(Parser *p, PNode *x, PNode *y, VecPNode *pvx, VecPNode *pvy) {
  uint i;
  VecPNode hx, hy, sx, sy;
  vec_clear(&hx);
  vec_clear(&hy);
  vec_clear(&sx);
  vec_clear(&sy);
  LATEST(p, x);
  LATEST(p, y);
  set_add(&sx, x);
  set_add(&sy, y);
  while (1) {
    if (!x && !y) break;
    if (!y || (x && x->height > y->height)) {
      get_children(p, x, &sx, &sy, &hx);
      x = heap_pop(&hx);
    } else {
      get_children(p, y, &sy, &sx, &hy);
      y = heap_pop(&hy);
    }
  }
  for (i = 0; i < sx.n; i++)
    if (sx.v[i] && !set_find(&sy, sx.v[i])) vec_add(pvx, sx.v[i]);
  for (i = 0; i < sy.n; i++)
    if (sy.v[i] && !set_find(&sx, sy.v[i])) vec_add(pvy, sy.v[i]);
  vec_free(&hx);
  vec_free(&hy);
  vec_free(&sx);
  vec_free(&sy);
}